

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTChannel.cpp
# Opt level: O2

void __thiscall
LTOnlineChannel::DebugLogRaw(LTOnlineChannel *this,char *data,long httpCode,bool bHeader)

{
  uint uVar1;
  char cVar2;
  int *piVar3;
  long lVar4;
  ostream *poVar5;
  string *psVar6;
  char *pcVar7;
  ostream *poVar8;
  double _zt;
  string sFileName;
  string dupData;
  string local_50;
  
  if (dataRefs.bDebugLogRawFd == 0) {
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      return;
    }
    std::ofstream::close();
    if ((int)dataRefs.iLogLevel < 3) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTChannel.cpp"
             ,0x282,"DebugLogRaw",logWARN,"DEBUG Stopped logging raw flight data to %s",
             "LTRawFD.log");
    }
    CreateMsgWindow(8.0,logWARN,"DEBUG Stopped logging raw flight data to %s","LTRawFD.log");
    return;
  }
  std::mutex::lock(&DebugLogRaw::logRawMutex);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&dupData,"LTRawFD.log",(allocator<char> *)&local_50);
    LTCalcFullPath(&sFileName,&dupData);
    std::__cxx11::string::~string((string *)&dupData);
    std::ofstream::open((string *)&outRaw,(_Ios_Openmode)&sFileName);
    uVar1 = *(uint *)(&DAT_002c4130 + *(long *)(outRaw + -0x18));
    if ((uVar1 & 5) == 0) {
      if ((int)dataRefs.iLogLevel < 3) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTChannel.cpp"
               ,0x29d,"DebugLogRaw",logWARN,"DEBUG Starting to log raw flight data to %s",
               "LTRawFD.log");
      }
      CreateMsgWindow(8.0,logWARN,"DEBUG Starting to log raw flight data to %s","LTRawFD.log");
    }
    else {
      piVar3 = __errno_location();
      strerror_r(*piVar3,(char *)&dupData,100);
      if ((int)dataRefs.iLogLevel < 4) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTChannel.cpp"
               ,0x299,"DebugLogRaw",logERR,"DEBUG Could not open output file %s: %s",
               sFileName._M_dataplus._M_p,&dupData);
      }
      CreateMsgWindow(12.0,logERR,"DEBUG Could not open output file %s: %s",
                      sFileName._M_dataplus._M_p,&dupData);
      dataRefs.bDebugLogRawFd = 0;
    }
    std::__cxx11::string::~string((string *)&sFileName);
    if ((uVar1 & 5) != 0) goto LAB_00156a69;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dupData,data,(allocator<char> *)&sFileName);
  lVar4 = std::__cxx11::string::find((char *)&dupData,0x21888d);
  if ((lVar4 != -1) && (lVar4 + 0x3cU <= dupData._M_string_length)) {
    std::__cxx11::string::replace((ulong)&dupData,lVar4 + 0x12,(char *)0x28);
  }
  lVar4 = std::__cxx11::string::find((char *)&dupData,0x21889e);
  if (lVar4 != -1) {
    std::__cxx11::string::erase((ulong)&dupData,lVar4 + 0xc);
    std::__cxx11::string::append((char *)&dupData);
  }
  lVar4 = std::__cxx11::string::find((char *)&dupData,0x2188bc);
  if (lVar4 != -1) {
    std::__cxx11::string::erase((ulong)&dupData,lVar4 + 0x1a);
    std::__cxx11::string::append((char *)&dupData);
  }
  _zt = GetSysTime();
  lVar4 = outRaw;
  poVar8 = (ostream *)&outRaw;
  *(undefined8 *)(&DAT_002c4118 + *(long *)(outRaw + -0x18)) = 2;
  if (bHeader) {
    if (httpCode == -1) {
      std::operator<<((ostream *)&outRaw,"\n");
      lVar4 = outRaw;
    }
    *(uint *)(&DAT_002c4128 + *(long *)(lVar4 + -0x18)) =
         *(uint *)(&DAT_002c4128 + *(long *)(lVar4 + -0x18)) & 0xfffffefb | 4;
    poVar5 = std::ostream::_M_insert<double>(_zt);
    poVar5 = std::operator<<(poVar5,' ');
    ts2string_abi_cxx11_(&sFileName,_zt,2);
    poVar5 = std::operator<<(poVar5,(string *)&sFileName);
    poVar5 = std::operator<<(poVar5," - SimTime ");
    DataRefs::GetSimTimeString_abi_cxx11_(&local_50,&dataRefs);
    poVar5 = std::operator<<(poVar5,(string *)&local_50);
    poVar5 = std::operator<<(poVar5," - ");
    std::operator<<(poVar5,(this->super_LTChannel).pszChName);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&sFileName);
    if (httpCode == -1) {
      pcVar7 = " SENDING:\n";
    }
    else if (httpCode == -2) {
      pcVar7 = " RECEIVED UDP:\n";
    }
    else if (httpCode == 0x194) {
      pcVar7 = " RECEIVED HTTP_NOT_FOUND (404):\n";
    }
    else if (httpCode == 200) {
      pcVar7 = " RECEIVED HTTP_OK:\n";
    }
    else {
      poVar8 = std::operator<<((ostream *)&outRaw," RECEIVED HTTP ");
      poVar8 = std::ostream::_M_insert<long>((long)poVar8);
      pcVar7 = ":\n";
    }
    std::operator<<(poVar8,pcVar7);
  }
  psVar6 = str_replPers(&dupData);
  poVar8 = std::operator<<((ostream *)&outRaw,(string *)psVar6);
  std::endl<char,std::char_traits<char>>(poVar8);
  std::__cxx11::string::~string((string *)&dupData);
LAB_00156a69:
  pthread_mutex_unlock((pthread_mutex_t *)&DebugLogRaw::logRawMutex);
  return;
}

Assistant:

void LTOnlineChannel::DebugLogRaw(const char *data, long httpCode, bool bHeader)
{
    // no logging? return (after closing the file if open)
    if (!dataRefs.GetDebugLogRawFD()) {
        if (outRaw.is_open()) {
            outRaw.close();
            SHOW_MSG(logWARN, DBG_RAW_FD_STOP, PATH_DEBUG_RAW_FD);
        }
        return;
    }
    
    // *** Logging enabled ***
    
    // As there are different threads (e.g. in LTRealTraffic), which send data,
    // we guard file writing with a lock, so that no line gets intermingled
    // with another thread's data:
    static std::mutex logRawMutex;
    std::lock_guard<std::mutex> lock(logRawMutex);
    
    // Need to open the file first?
    if (!outRaw.is_open()) {
        // open the file, append to it
        std::string sFileName (LTCalcFullPath(PATH_DEBUG_RAW_FD));
        outRaw.open (sFileName, std::ios_base::out | std::ios_base::app);
        if (!outRaw) {
            char sErr[SERR_LEN];
            strerror_s(sErr, sizeof(sErr), errno);
            // could not open output file: bail out, decativate logging
            SHOW_MSG(logERR, DBG_RAW_FD_ERR_OPEN_OUT,
                     sFileName.c_str(), sErr);
            dataRefs.SetDebugLogRawFD(false);
            return;
        }
        SHOW_MSG(logWARN, DBG_RAW_FD_START, PATH_DEBUG_RAW_FD);
    }
    
    // Receives modifiable copy of the data
    std::string dupData (data);
    
    // Overwrite client_secret
    // {"grant_type": "password","client_id": 1,"client_secret": "7HTOw2421WBZxrGCksPvez2BG6Yl918uUHAcEWRg","username":
    std::string::size_type pos = dupData.find("\"client_secret\":");
    if (pos != std::string::npos && dupData.size() >= pos + 60)
        dupData.replace(pos+18, 40, "...");
    
    // limit output in case a password or token is found
    pos = dupData.find("\"password\":");
    if (pos != std::string::npos) {
        // just truncate after the password tag so the actual password is gone
        dupData.erase(pos + 12);
        dupData += "...(truncated)...";
    }
    
    pos = dupData.find("\"access_token\":");
    if (pos != std::string::npos) {
        dupData.erase(pos + 26);
        dupData += "...(truncated)...";
    }
    
    // timestamp (numerical and human readable)
    const double now = GetSysTime();
    outRaw.precision(2);
    if (bHeader) {
        
        // Empty line before a (new) SENDING request
        if (httpCode == HTTP_FLAG_SENDING)
            outRaw << "\n";

        // Actual header
        outRaw
        << std::fixed << now << ' ' << ts2string(now,2)
        << " - SimTime "
        << dataRefs.GetSimTimeString()
        << " - "
        // Channel's name
        << ChName();

        if (httpCode == HTTP_FLAG_SENDING)
            outRaw << " SENDING:\n";
        else if (httpCode == HTTP_FLAG_UDP)
            outRaw << " RECEIVED UDP:\n";
        else if (httpCode == HTTP_OK)
            outRaw << " RECEIVED HTTP_OK:\n";
        else if (httpCode == HTTP_NOT_FOUND)
            outRaw << " RECEIVED HTTP_NOT_FOUND (404):\n";
        else
            outRaw << " RECEIVED HTTP " << httpCode << ":\n";
    }
    // Output the actual text
    outRaw
    // the actual given data, stripped from general personal data
    << str_replPers(dupData)
    // newlines + flush
    << std::endl;
}